

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

ScenarioUpperBound * __thiscall
despot::POMDPX::CreateScenarioUpperBound(POMDPX *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  int iVar2;
  MDPUpperBound *this_00;
  LookaheadUpperBound *this_01;
  undefined4 extraout_var;
  ostream *poVar3;
  string local_40 [32];
  
  if (this->is_small_ == false) {
    this_00 = (MDPUpperBound *)operator_new(0x10);
    TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_00,&this->super_DSPOMDP);
  }
  else {
    bVar1 = std::operator==(name,"TRIVIAL");
    if (bVar1) {
      this_00 = (MDPUpperBound *)operator_new(0x10);
      TrivialParticleUpperBound::TrivialParticleUpperBound
                ((TrivialParticleUpperBound *)this_00,&this->super_DSPOMDP);
    }
    else {
      bVar1 = std::operator==(name,"MDP");
      if ((!bVar1) && (bVar1 = std::operator==(name,"DEFAULT"), !bVar1)) {
        bVar1 = std::operator==(name,"LOOKAHEAD");
        if (bVar1) {
          this_01 = (LookaheadUpperBound *)operator_new(0x38);
          std::__cxx11::string::string(local_40,(string *)particle_bound_name);
          iVar2 = (*(this->super_MDP)._vptr_MDP[0x11])(this,local_40);
          LookaheadUpperBound::LookaheadUpperBound
                    (this_01,&this->super_DSPOMDP,&this->super_StateIndexer,
                     (ParticleUpperBound *)CONCAT44(extraout_var,iVar2));
          std::__cxx11::string::~string(local_40);
          return &this_01->super_ScenarioUpperBound;
        }
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario upper bound: ");
        poVar3 = std::operator<<(poVar3,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar3);
        exit(1);
      }
      this_00 = (MDPUpperBound *)operator_new(0x38);
      MDPUpperBound::MDPUpperBound(this_00,&this->super_MDP,&this->super_StateIndexer);
    }
  }
  return (ScenarioUpperBound *)this_00;
}

Assistant:

ScenarioUpperBound* POMDPX::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (!is_small_) {
		return new TrivialParticleUpperBound(this);
	}

	const StateIndexer* indexer = this;

	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new MDPUpperBound(this, *this);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *indexer,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}